

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp9d_api.c
# Opt level: O0

MPP_RET hal_vp9d_deinit(void *ctx)

{
  HalVp9dCtx *p;
  MPP_RET ret;
  void *ctx_local;
  
  p._4_4_ = MPP_NOK;
  if (((ctx != (void *)0x0) && (*ctx != 0)) && (*(long *)(*ctx + 0x20) != 0)) {
    p._4_4_ = (**(code **)(*ctx + 0x20))(ctx);
  }
  if (*(long *)((long)ctx + 0x10) != 0) {
    mpp_dev_deinit(*(MppDev *)((long)ctx + 0x10));
    *(undefined8 *)((long)ctx + 0x10) = 0;
  }
  return p._4_4_;
}

Assistant:

MPP_RET hal_vp9d_deinit(void *ctx)
{
    MPP_RET ret = MPP_NOK;
    HalVp9dCtx *p = (HalVp9dCtx *)ctx;

    if (p && p->api && p->api->deinit)
        ret = p->api->deinit(ctx);

    if (p->dev) {
        mpp_dev_deinit(p->dev);
        p->dev = NULL;
    }

    return ret;
}